

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_crosser.h
# Opt level: O3

void __thiscall S2EdgeCrosser::S2EdgeCrosser(S2EdgeCrosser *this,S2Point *a,S2Point *b)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  bool bVar7;
  S2LogMessage SStack_18;
  
  this->a_ = a;
  this->b_ = b;
  dVar1 = b->c_[0];
  dVar2 = a->c_[0];
  dVar3 = a->c_[1];
  dVar4 = a->c_[2];
  dVar5 = b->c_[1];
  dVar6 = b->c_[2];
  (this->a_cross_b_).c_[0] = dVar6 * dVar3 - dVar4 * dVar5;
  (this->a_cross_b_).c_[1] = dVar1 * dVar4 - dVar2 * dVar6;
  (this->a_cross_b_).c_[2] = dVar5 * dVar2 - dVar3 * dVar1;
  this->have_tangents_ = false;
  (this->a_tangent_).c_[0] = 0.0;
  (this->a_tangent_).c_[1] = 0.0;
  (this->a_tangent_).c_[2] = 0.0;
  (this->b_tangent_).c_[0] = 0.0;
  (this->b_tangent_).c_[1] = 0.0;
  (this->b_tangent_).c_[2] = 0.0;
  this->c_ = (S2Point *)0x0;
  bVar7 = S2::IsUnitLength(a);
  if (bVar7) {
    bVar7 = S2::IsUnitLength(b);
    if (bVar7) {
      return;
    }
    S2LogMessage::S2LogMessage
              (&SStack_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_crosser.h"
               ,0xe3,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (SStack_18.stream_,"Check failed: S2::IsUnitLength(*b) ",0x23);
  }
  else {
    S2LogMessage::S2LogMessage
              (&SStack_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_crosser.h"
               ,0xe2,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (SStack_18.stream_,"Check failed: S2::IsUnitLength(*a) ",0x23);
  }
  abort();
}

Assistant:

inline S2EdgeCrosser::S2EdgeCrosser(const S2Point* a, const S2Point* b)
    : a_(a), b_(b), a_cross_b_(a_->CrossProd(*b_)), have_tangents_(false),
      c_(nullptr) {
  S2_DCHECK(S2::IsUnitLength(*a));
  S2_DCHECK(S2::IsUnitLength(*b));
}